

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall xemmai::ast::t_if::f_flow(t_if *this,t_flow *a_flow)

{
  t_block *a_next;
  pointer puVar1;
  t_node *ptVar2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  pointer puVar3;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p_1;
  t_block *a_next_00;
  t_block *a_next_01;
  
  (*((this->v_condition)._M_t.
     super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>._M_t.
     super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
     super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl)->_vptr_t_node[2])();
  a_next_00 = &this->v_block_true;
  t_block::f_next(a_flow->v_current,a_next_00);
  a_next_01 = &this->v_block_false;
  t_block::f_next(a_flow->v_current,a_next_01);
  a_flow->v_current = a_next_00;
  puVar3 = (this->v_true).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->v_true).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      ptVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    a_next_00 = a_flow->v_current;
  }
  a_next = &this->v_junction;
  t_block::f_next(a_next_00,a_next);
  a_flow->v_current = a_next_01;
  puVar3 = (this->v_false).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->v_false).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      ptVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    a_next_01 = a_flow->v_current;
  }
  t_block::f_next(a_next_01,a_next);
  t_block::f_next(a_next,&this->v_block_exit);
  a_flow->v_current = &this->v_block_exit;
  return;
}

Assistant:

void t_if::f_flow(t_flow& a_flow)
{
	v_condition->f_flow(a_flow);
	a_flow.v_current->f_next(&v_block_true);
	a_flow.v_current->f_next(&v_block_false);
	a_flow.v_current = &v_block_true;
	for (auto& p : v_true) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction);
	a_flow.v_current = &v_block_false;
	for (auto& p : v_false) p->f_flow(a_flow);
	a_flow.v_current->f_next(&v_junction);
	v_junction.f_next(&v_block_exit);
	a_flow.v_current = &v_block_exit;
}